

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bhtree.cpp
# Opt level: O1

void __thiscall BHTree::updateForce(BHTree *this,shared_ptr<Body> *body)

{
  element_type *peVar1;
  element_type *this_00;
  double dVar2;
  double dVar3;
  
  while( true ) {
    peVar1 = (this->body).super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (this_00 = (body->super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
       this_00 == peVar1)) {
      return;
    }
    if (((((this->firstQuad).super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (element_type *)0x0) &&
         ((this->secondQuad).super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0)) &&
        ((this->thirdQuad).super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (element_type *)0x0)) &&
       ((this->fourthQuad).super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0)) break;
    dVar2 = Quad::getLength((this->quad).super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           );
    dVar3 = Body::distanceTo((this->body).super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,body);
    if (dVar2 / dVar3 < this->THETA) {
      this_00 = (body->super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      break;
    }
    updateForce((this->firstQuad).super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,body
               );
    updateForce((this->secondQuad).super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                body);
    updateForce((this->thirdQuad).super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,body
               );
    this = (this->fourthQuad).super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  Body::addForce(this_00,&this->body);
  return;
}

Assistant:

void BHTree::updateForce(const std::shared_ptr<Body> &body) {
    if (this->body == nullptr || body == this->body) {
        return;
    }

    if (this->isExternal()) {
        body->addForce(this->body);
    } else {
        double s = this->quad->getLength();
        double d = this->body->distanceTo(body);

        if (s / d < THETA) {
            body->addForce(this->body);
        } else {
            this->firstQuad->updateForce(body);
            this->secondQuad->updateForce(body);
            this->thirdQuad->updateForce(body);
            this->fourthQuad->updateForce(body);
        }
    }
}